

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::TestCaseInfo::addFilenameTag(TestCaseInfo *this)

{
  anon_unknown_26 *this_00;
  char *pcVar1;
  size_type extraout_RDX;
  StringRef filename;
  StringRef SVar2;
  string combined;
  long *local_40;
  size_type local_38;
  long local_30 [2];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"#","");
  this_00 = (anon_unknown_26 *)(this->lineInfo).file;
  pcVar1 = (char *)strlen((char *)this_00);
  filename.m_size = extraout_RDX;
  filename.m_start = pcVar1;
  SVar2 = anon_unknown_26::extractFilenamePart(this_00,filename);
  std::__cxx11::string::append((char *)&local_40,(ulong)SVar2.m_start);
  SVar2.m_size = local_38;
  SVar2.m_start = (char *)local_40;
  internalAppendTag(this,SVar2);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return;
}

Assistant:

void TestCaseInfo::addFilenameTag() {
        std::string combined("#");
        combined += extractFilenamePart(lineInfo.file);
        internalAppendTag(combined);
    }